

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transit.cpp
# Opt level: O3

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
Vault::Transit::generateRandomBytes
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Transit *this,int num_bytes,Parameters *parameters)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Client *client;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *poVar2
  ;
  uint uVar3;
  long *plVar4;
  uint uVar5;
  ulong uVar6;
  ulong *puVar7;
  uint __val;
  uint __len;
  string __str;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  Parameters *local_a0;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_98;
  long *local_90 [2];
  long local_80 [2];
  Path local_70;
  Url local_50;
  
  __val = -num_bytes;
  if (0 < num_bytes) {
    __val = num_bytes;
  }
  __len = 1;
  if (9 < __val) {
    uVar6 = (ulong)__val;
    uVar3 = 4;
    do {
      __len = uVar3;
      uVar5 = (uint)uVar6;
      if (uVar5 < 100) {
        __len = __len - 2;
        goto LAB_0018b492;
      }
      if (uVar5 < 1000) {
        __len = __len - 1;
        goto LAB_0018b492;
      }
      if (uVar5 < 10000) goto LAB_0018b492;
      uVar6 = uVar6 / 10000;
      uVar3 = __len + 4;
    } while (99999 < uVar5);
    __len = __len + 1;
  }
LAB_0018b492:
  client = *(Client **)this;
  local_90[0] = local_80;
  local_a0 = parameters;
  local_98 = __return_storage_ptr__;
  std::__cxx11::string::_M_construct((ulong)local_90,(char)__len - (char)(num_bytes >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)((uint)num_bytes >> 0x1f) + (long)local_90[0]),__len,__val);
  plVar4 = (long *)std::__cxx11::string::replace((ulong)local_90,0,(char *)0x0,0x1a2542);
  puVar7 = (ulong *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar7) {
    local_b0._M_allocated_capacity = *puVar7;
    local_b0._8_8_ = plVar4[3];
    local_70.value_._M_dataplus._M_p = (pointer)&local_b0;
  }
  else {
    local_b0._M_allocated_capacity = *puVar7;
    local_70.value_._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_70.value_._M_string_length = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  paVar1 = &local_70.value_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.value_._M_dataplus._M_p == &local_b0) {
    local_70.value_.field_2._8_8_ = local_b0._8_8_;
    local_70.value_._M_dataplus._M_p = (pointer)paVar1;
  }
  local_70.value_.field_2._M_allocated_capacity = local_b0._M_allocated_capacity;
  local_b0._M_allocated_capacity = local_b0._M_allocated_capacity & 0xffffffffffffff00;
  getUrl(&local_50,this,&local_70);
  poVar2 = local_98;
  HttpConsumer::post(local_98,client,&local_50,local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.value_._M_dataplus._M_p != &local_50.value_.field_2) {
    operator_delete(local_50.value_._M_dataplus._M_p,
                    local_50.value_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.value_._M_dataplus._M_p != paVar1) {
    operator_delete(local_70.value_._M_dataplus._M_p,
                    local_70.value_.field_2._M_allocated_capacity + 1);
  }
  if (local_90[0] != local_80) {
    operator_delete(local_90[0],local_80[0] + 1);
  }
  return poVar2;
}

Assistant:

std::optional<std::string>
Vault::Transit::generateRandomBytes(int num_bytes,
                                    const Parameters &parameters) {
  return HttpConsumer::post(
      client_, getUrl(Path{"random/" + std::to_string(num_bytes)}), parameters);
}